

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EPoller.cpp
# Opt level: O2

void __thiscall EPoller::EPoller(EPoller *this)

{
  int iVar1;
  Logger local_ff8;
  
  iVar1 = epoll_create1(0x80000);
  this->epollfd_ = iVar1;
  std::vector<epoll_event,_std::allocator<epoll_event>_>::vector
            (&this->events_,0x1000,(allocator_type *)&local_ff8);
  (this->channels_)._M_h._M_buckets = &(this->channels_)._M_h._M_single_bucket;
  (this->channels_)._M_h._M_bucket_count = 1;
  (this->channels_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->channels_)._M_h._M_element_count = 0;
  (this->channels_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->channels_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->channels_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if (this->epollfd_ < 0) {
    Logger::Logger(&local_ff8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EPoller.cpp"
                   ,0xb);
    LogStream::operator<<((LogStream *)&local_ff8,"Error: Epoller");
    Logger::~Logger(&local_ff8);
  }
  return;
}

Assistant:

EPoller::EPoller() : epollfd_(epoll_create1(EPOLL_CLOEXEC)), events_(kEventInit) {
    if (epollfd_ < 0) {
        LOG << "Error: Epoller";
    }
}